

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_bpf_process_pcm_frames
                    (ma_bpf *pBPF,void *pFramesOut,void *pFramesIn,ma_uint64 frameCount)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ma_bpf2 *pmVar15;
  ma_biquad_coefficient *pmVar16;
  int iVar17;
  int iVar18;
  ma_result mVar19;
  ulong uVar20;
  undefined2 uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  float *pFramesOutF32;
  float fVar27;
  
  if (pBPF == (ma_bpf *)0x0) {
    mVar19 = MA_INVALID_ARGS;
  }
  else if (pFramesOut == pFramesIn) {
    uVar20 = 0xffffffffffffffff;
    lVar23 = 0;
    do {
      uVar20 = uVar20 + 1;
      if (pBPF->bpf2Count <= uVar20) goto LAB_0013edda;
      mVar19 = ma_bpf2_process_pcm_frames
                         ((ma_bpf2 *)((long)&(pBPF->pBPF2->bq).format + lVar23),pFramesOut,
                          pFramesOut,frameCount);
      lVar23 = lVar23 + 0x40;
    } while (mVar19 == MA_SUCCESS);
  }
  else {
    if (pBPF->format == ma_format_f32) {
      for (uVar20 = 0; uVar20 < frameCount; uVar20 = (ulong)((int)uVar20 + 1)) {
        memcpy(pFramesOut,pFramesIn,
               (ulong)(*(int *)(&DAT_00176420 + (ulong)pBPF->format * 4) * pBPF->channels));
        for (uVar25 = 0; uVar25 < pBPF->bpf2Count; uVar25 = uVar25 + 1) {
          pmVar15 = pBPF->pBPF2;
          uVar8 = pmVar15[uVar25].bq.channels;
          fVar1 = pmVar15[uVar25].bq.b0.f32;
          fVar2 = pmVar15[uVar25].bq.b1.f32;
          fVar3 = pmVar15[uVar25].bq.b2.f32;
          fVar4 = pmVar15[uVar25].bq.a1.f32;
          fVar5 = pmVar15[uVar25].bq.a2.f32;
          for (uVar24 = 0; uVar8 != uVar24; uVar24 = uVar24 + 1) {
            pmVar16 = pmVar15[uVar25].bq.pR1;
            fVar6 = *(float *)((long)pFramesOut + uVar24 * 4);
            fVar27 = fVar1 * fVar6 + pmVar16[uVar24].f32;
            fVar7 = pmVar15[uVar25].bq.pR2[uVar24].f32;
            *(float *)((long)pFramesOut + uVar24 * 4) = fVar27;
            pmVar16[uVar24].f32 = fVar2 * fVar6 + fVar27 * -fVar4 + fVar7;
            pmVar15[uVar25].bq.pR2[uVar24].f32 = fVar6 * fVar3 + fVar27 * -fVar5;
          }
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pBPF->channels * 4);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pBPF->channels * 4);
      }
    }
    else {
      if (pBPF->format != ma_format_s16) {
        return MA_INVALID_OPERATION;
      }
      for (uVar20 = 0; uVar20 < frameCount; uVar20 = (ulong)((int)uVar20 + 1)) {
        memcpy(pFramesOut,pFramesIn,
               (ulong)(*(int *)(&DAT_00176420 + (ulong)pBPF->format * 4) * pBPF->channels));
        for (uVar25 = 0; uVar25 < pBPF->bpf2Count; uVar25 = uVar25 + 1) {
          pmVar15 = pBPF->pBPF2;
          uVar8 = pmVar15[uVar25].bq.channels;
          iVar9 = pmVar15[uVar25].bq.b0.s32;
          iVar10 = pmVar15[uVar25].bq.b1.s32;
          iVar11 = pmVar15[uVar25].bq.b2.s32;
          iVar12 = pmVar15[uVar25].bq.a1.s32;
          iVar13 = pmVar15[uVar25].bq.a2.s32;
          for (uVar24 = 0; uVar8 != uVar24; uVar24 = uVar24 + 1) {
            pmVar16 = pmVar15[uVar25].bq.pR1;
            iVar26 = (int)*(short *)((long)pFramesOut + uVar24 * 2);
            iVar22 = iVar9 * iVar26 + pmVar16[uVar24].s32 >> 0xe;
            iVar14 = pmVar15[uVar25].bq.pR2[uVar24].s32;
            iVar17 = iVar12 * iVar22;
            iVar18 = iVar22 * iVar13;
            if (0x7ffe < iVar22) {
              iVar22 = 0x7fff;
            }
            uVar21 = (undefined2)iVar22;
            if (iVar22 < -0x7fff) {
              uVar21 = 0x8000;
            }
            *(undefined2 *)((long)pFramesOut + uVar24 * 2) = uVar21;
            pmVar16[uVar24].s32 = (iVar10 * iVar26 + iVar14) - iVar17;
            pmVar15[uVar25].bq.pR2[uVar24].s32 = iVar26 * iVar11 - iVar18;
          }
        }
        pFramesOut = (void *)((long)pFramesOut + (ulong)pBPF->channels * 2);
        pFramesIn = (void *)((long)pFramesIn + (ulong)pBPF->channels * 2);
      }
    }
LAB_0013edda:
    mVar19 = MA_SUCCESS;
  }
  return mVar19;
}

Assistant:

MA_API ma_result ma_bpf_process_pcm_frames(ma_bpf* pBPF, void* pFramesOut, const void* pFramesIn, ma_uint64 frameCount)
{
    ma_result result;
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Faster path for in-place. */
    if (pFramesOut == pFramesIn) {
        for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
            result = ma_bpf2_process_pcm_frames(&pBPF->pBPF2[ibpf2], pFramesOut, pFramesOut, frameCount);
            if (result != MA_SUCCESS) {
                return result;
            }
        }
    }

    /* Slightly slower path for copying. */
    if (pFramesOut != pFramesIn) {
        ma_uint32 iFrame;

        /*  */ if (pBPF->format == ma_format_f32) {
            /* */ float* pFramesOutF32 = (      float*)pFramesOut;
            const float* pFramesInF32  = (const float*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutF32, pFramesInF32, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_f32(&pBPF->pBPF2[ibpf2], pFramesOutF32, pFramesOutF32);
                }

                pFramesOutF32 += pBPF->channels;
                pFramesInF32  += pBPF->channels;
            }
        } else if (pBPF->format == ma_format_s16) {
            /* */ ma_int16* pFramesOutS16 = (      ma_int16*)pFramesOut;
            const ma_int16* pFramesInS16  = (const ma_int16*)pFramesIn;

            for (iFrame = 0; iFrame < frameCount; iFrame += 1) {
                MA_COPY_MEMORY(pFramesOutS16, pFramesInS16, ma_get_bytes_per_frame(pBPF->format, pBPF->channels));

                for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
                    ma_bpf2_process_pcm_frame_s16(&pBPF->pBPF2[ibpf2], pFramesOutS16, pFramesOutS16);
                }

                pFramesOutS16 += pBPF->channels;
                pFramesInS16  += pBPF->channels;
            }
        } else {
            MA_ASSERT(MA_FALSE);
            return MA_INVALID_OPERATION;    /* Should never hit this. */
        }
    }

    return MA_SUCCESS;
}